

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_map_custom3_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,ggml_custom3_op_t fun,
          int n_tasks,void *userdata,_Bool inplace)

{
  ggml_tensor *tensor;
  ggml_map_custom3_op_params params;
  
  if (0 < n_tasks || n_tasks == -1) {
    if (inplace) {
      tensor = ggml_view_tensor(ctx,a);
    }
    else {
      tensor = ggml_dup_tensor(ctx,a);
    }
    params.userdata = userdata;
    params.fun = fun;
    params.n_tasks = n_tasks;
    ggml_set_op_params(tensor,&params,0x18);
    tensor->op = GGML_OP_MAP_CUSTOM3;
    tensor->src[0] = a;
    tensor->src[1] = b;
    tensor->src[2] = c;
    return tensor;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",0x1380,
             "GGML_ASSERT(%s) failed","n_tasks == GGML_N_TASKS_MAX || n_tasks > 0");
}

Assistant:

static struct ggml_tensor * ggml_map_custom3_impl(
        struct ggml_context      * ctx,
        struct ggml_tensor       * a,
        struct ggml_tensor       * b,
        struct ggml_tensor       * c,
        const  ggml_custom3_op_t   fun,
        int                        n_tasks,
        void                     * userdata,
        bool                       inplace) {
    GGML_ASSERT(n_tasks == GGML_N_TASKS_MAX || n_tasks > 0);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    struct ggml_map_custom3_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op     = GGML_OP_MAP_CUSTOM3;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}